

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyConcaveCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall btSoftBodyTriangleCallback::clearCache(btSoftBodyTriangleCallback *this)

{
  int iVar1;
  btTriIndex *pbVar2;
  long in_RDI;
  btCollisionShape *in_stack_00000008;
  btSparseSdf<3> *in_stack_00000010;
  btTriIndex *tmp;
  int i;
  int in_stack_ffffffffffffffcc;
  btHashMap<btHashKey<btTriIndex>,_btTriIndex> *in_stack_ffffffffffffffd0;
  int local_c;
  
  local_c = 0;
  while( true ) {
    iVar1 = btHashMap<btHashKey<btTriIndex>,_btTriIndex>::size
                      ((btHashMap<btHashKey<btTriIndex>,_btTriIndex> *)0x28c411);
    if (iVar1 <= local_c) break;
    pbVar2 = btHashMap<btHashKey<btTriIndex>,_btTriIndex>::getAtIndex
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    btSoftBody::getWorldInfo(*(btSoftBody **)(in_RDI + 8));
    btSparseSdf<3>::RemoveReferences(in_stack_00000010,in_stack_00000008);
    in_stack_ffffffffffffffd0 = (btHashMap<btHashKey<btTriIndex>,_btTriIndex> *)pbVar2->m_childShape
    ;
    if (in_stack_ffffffffffffffd0 != (btHashMap<btHashKey<btTriIndex>,_btTriIndex> *)0x0) {
      (*(*(_func_int ***)&in_stack_ffffffffffffffd0->m_hashTable)[1])();
    }
    local_c = local_c + 1;
  }
  btHashMap<btHashKey<btTriIndex>,_btTriIndex>::clear(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void	btSoftBodyTriangleCallback::clearCache()
{
	for (int i=0;i<m_shapeCache.size();i++)
	{
		btTriIndex* tmp = m_shapeCache.getAtIndex(i);
		btAssert(tmp);
		btAssert(tmp->m_childShape);
		m_softBody->getWorldInfo()->m_sparsesdf.RemoveReferences(tmp->m_childShape);//necessary?
		delete tmp->m_childShape;
	}
	m_shapeCache.clear();
}